

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Render.cpp
# Opt level: O0

void render_scene(Scene *scene,double half_width,double half_height,int nx,int ny,char *fname)

{
  pointer pTVar1;
  rgb local_110 [2];
  Vector local_108;
  Vector local_f0;
  Color local_d8;
  rgb local_ab;
  rgb c;
  __single_object tga;
  int j;
  int i;
  Vector color;
  Ray ray;
  double hy;
  double hx;
  double y;
  double x;
  char *fname_local;
  int ny_local;
  int nx_local;
  double half_height_local;
  double half_width_local;
  Scene *scene_local;
  
  x = (double)fname;
  fname_local._0_4_ = ny;
  fname_local._4_4_ = nx;
  _ny_local = half_height;
  half_height_local = half_width;
  half_width_local = (double)scene;
  Ray::Ray((Ray *)&color.z);
  Vector::Vector((Vector *)&j);
  std::make_unique<TargaImage,char_const*&,int&,int&>
            ((char **)&stack0xffffffffffffff58,(int *)&x,(int *)((long)&fname_local + 4));
  rgb::rgb(&local_ab,'\0');
  hx = _ny_local;
  for (tga._M_t.super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
       super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
       super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_ = 0;
      tga._M_t.super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
      super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
      super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_ < (int)fname_local;
      tga._M_t.super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
      super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
      super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_ =
           tga._M_t.super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
           super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
           super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_ + 1) {
    y = -half_height_local;
    for (tga._M_t.super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
         super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
         super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._0_4_ = 0;
        (int)tga._M_t.super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
             super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
             super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl < fname_local._4_4_;
        tga._M_t.super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
        super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
        super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._0_4_ =
             (int)tga._M_t.super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
                  super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
                  super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl + 1) {
      TotalPixels = TotalPixels + 1;
      Scene::camera((Scene *)half_width_local,y,hx,(Ray *)&color.z);
      Scene::trace(&local_d8,(Scene *)half_width_local,&Grayzer::Medium::air,1.0,(Ray *)&color.z);
      Vector::operator=((Vector *)&j,&local_d8);
      Vector::Vector(&local_f0,(Vector *)&j);
      clip(&local_108,&local_f0);
      local_ab.g = (uint8_t)(int)(color.x * 255.0);
      local_ab.r = (uint8_t)(int)(_j * 255.0);
      local_ab.b = (uint8_t)(int)(color.y * 255.0);
      pTVar1 = std::unique_ptr<TargaImage,_std::default_delete<TargaImage>_>::operator->
                         ((unique_ptr<TargaImage,_std::default_delete<TargaImage>_> *)
                          &stack0xffffffffffffff58);
      local_110[0] = (rgb)CONCAT12(local_ab.b,local_ab._0_2_);
      (*(pTVar1->super_Image)._vptr_Image[3])(pTVar1,CONCAT53(0,local_110[0]));
      y = (half_width + half_width) / (double)nx + y;
    }
    hx = hx - (half_height + half_height) / (double)ny;
  }
  std::unique_ptr<TargaImage,_std::default_delete<TargaImage>_>::~unique_ptr
            ((unique_ptr<TargaImage,_std::default_delete<TargaImage>_> *)&stack0xffffffffffffff58);
  return;
}

Assistant:

void render_scene(Scene* scene, double half_width, double half_height,
               int nx, int ny,
               char const* fname)
{
   double x, y;
   double hx = 2.0   * half_width  /   nx;
   double hy = 2.0   * half_height /   ny;
   Ray   ray;
   Vector color;
   int   i, j;

   auto tga = std::make_unique<TargaImage>( fname, nx, ny );
   rgb   c;

/* $NB$ what is it? where it from?  how   it got here?

   left unused: does much unnecessary work   (I think so),
            produces very funny  TGA   files (pixels intermixed)
   for(int  yfactor  = 16; yfactor >   0; yfactor--)
      for(int  xfactor  = 16; xfactor >   0; xfactor--)
         for(i=0,y=HalfHeight;i<ny;i+=yfactor,y-=hy*yfactor)
         {
            for(j=0,x=-HalfWidth;j<nx;j+=xfactor,x+=hx*xfactor)
*/
   for( i = 0, y =   half_height; i < ny; i++, y   -= hy )
   {
      for( j = 0, x =   -half_width; j < nx; j++, x   += hx )
      {
         TotalPixels++;

         scene->camera(x, y, ray);

         color = scene->trace( Grayzer::Medium::air, 1.0, ray );
         clip( color );

         c.r   = color.x * 255;
         c.g   = color.y * 255;
         c.b   = color.z * 255;

         tga->put_pixel(c);
      }
   }
}